

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_db_archive.cpp
# Opt level: O3

void __thiscall
DbArchive_ReadASingleUint64_Test::DbArchive_ReadASingleUint64_Test
          (DbArchive_ReadASingleUint64_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_DbArchive).super_Test._vptr_Test = (_func_int **)&PTR__DbArchive_0026b0f0;
  in_memory_store::in_memory_store(&(this->super_DbArchive).store_);
  (this->super_DbArchive).super_Test._vptr_Test = (_func_int **)&PTR__DbArchive_0026ae98;
  return;
}

Assistant:

TEST_F (DbArchive, ReadASingleUint64) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    std::uint64_t v1 = UINT64_C (0xF0F0F0F0F0F0F0F0);

    // Append v1 to the store (we don't need to have committed the transaction to be able to access
    // its contents).
    mock_mutex mutex;
    auto transaction = begin (db, std::unique_lock<mock_mutex>{mutex});
    pstore::typed_address<std::uint64_t> addr = append_uint64 (transaction, v1);

    // Now try reading it back again using a serializer.
    pstore::serialize::archive::database_reader archive (db, addr.to_address ());
    std::uint64_t const v2 = pstore::serialize::read<std::uint64_t> (archive);
    EXPECT_EQ (v1, v2);
}